

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void deqp::gls::LifetimeTests::details::setupFbo(Context *ctx,GLuint seed,GLuint fbo)

{
  deUint32 dVar1;
  deBool dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  RenderContext *pRVar7;
  deUint32 extraout_var;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  GLfloat a2;
  GLfloat b2;
  GLfloat g2;
  GLfloat r2;
  GLfloat a1;
  GLfloat b1;
  GLfloat g1;
  GLfloat r1;
  GLint y;
  GLint x;
  GLsizei height;
  undefined1 local_30 [4];
  GLsizei width;
  Random rnd;
  Functions *gl;
  GLuint fbo_local;
  GLuint seed_local;
  Context *ctx_local;
  
  pRVar7 = Context::getRenderContext(ctx);
  rnd.m_rnd.z = (*pRVar7->_vptr_RenderContext[3])();
  rnd.m_rnd.w = extraout_var;
  do {
    (**(code **)(rnd.m_rnd._8_8_ + 0x78))(0x8d40,fbo);
    dVar1 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
    glu::checkError(dVar1,"gl.bindFramebuffer(GL_FRAMEBUFFER, fbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0xc2);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if (seed == 0) {
    (**(code **)(rnd.m_rnd._8_8_ + 0x1c0))(0,0,0,0x3f800000);
    do {
      (**(code **)(rnd.m_rnd._8_8_ + 0x188))(0x4000);
      dVar1 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
      glu::checkError(dVar1,"gl.clear(GL_COLOR_BUFFER_BIT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                      ,199);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
  }
  else {
    de::Random::Random((Random *)local_30,seed);
    iVar3 = de::Random::getInt((Random *)local_30,0,0x80);
    iVar4 = de::Random::getInt((Random *)local_30,0,0x80);
    iVar5 = de::Random::getInt((Random *)local_30,0,0x80 - iVar3);
    iVar6 = de::Random::getInt((Random *)local_30,0,0x80 - iVar4);
    fVar8 = de::Random::getFloat((Random *)local_30);
    fVar9 = de::Random::getFloat((Random *)local_30);
    fVar10 = de::Random::getFloat((Random *)local_30);
    fVar11 = de::Random::getFloat((Random *)local_30);
    fVar12 = de::Random::getFloat((Random *)local_30);
    fVar13 = de::Random::getFloat((Random *)local_30);
    fVar14 = de::Random::getFloat((Random *)local_30);
    fVar15 = de::Random::getFloat((Random *)local_30);
    do {
      (**(code **)(rnd.m_rnd._8_8_ + 0x1c0))(fVar8,fVar9,fVar10,fVar11);
      dVar1 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
      glu::checkError(dVar1,"gl.clearColor(r1, g1, b1, a1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                      ,0xd9);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      (**(code **)(rnd.m_rnd._8_8_ + 0x188))(0x4000);
      dVar1 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
      glu::checkError(dVar1,"gl.clear(GL_COLOR_BUFFER_BIT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                      ,0xda);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    (**(code **)(rnd.m_rnd._8_8_ + 0x1290))(iVar5,iVar6,iVar3,iVar4);
    (**(code **)(rnd.m_rnd._8_8_ + 0x5e0))(0xc11);
    (**(code **)(rnd.m_rnd._8_8_ + 0x1c0))(fVar12,fVar13,fVar14,fVar15);
    (**(code **)(rnd.m_rnd._8_8_ + 0x188))(0x4000);
    (**(code **)(rnd.m_rnd._8_8_ + 0x4e8))(0xc11);
    de::Random::~Random((Random *)local_30);
  }
  (**(code **)(rnd.m_rnd._8_8_ + 0x78))(0x8d40,0);
  dVar1 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar1,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0xe3);
  return;
}

Assistant:

void setupFbo (const Context& ctx, GLuint seed, GLuint fbo)
{
	const Functions& gl = ctx.getRenderContext().getFunctions();

	GLU_CHECK_CALL_ERROR(gl.bindFramebuffer(GL_FRAMEBUFFER, fbo),
						 gl.getError());

	if (seed == 0)
	{
		gl.clearColor(0.0, 0.0, 0.0, 1.0);
		GLU_CHECK_CALL_ERROR(gl.clear(GL_COLOR_BUFFER_BIT), gl.getError());
	}
	else
	{
		Random			rnd		(seed);
		const GLsizei	width	= rnd.getInt(0, FRAMEBUFFER_SIZE);
		const GLsizei	height	= rnd.getInt(0, FRAMEBUFFER_SIZE);
		const GLint		x		= rnd.getInt(0, FRAMEBUFFER_SIZE - width);
		const GLint		y		= rnd.getInt(0, FRAMEBUFFER_SIZE - height);
		const GLfloat	r1		= rnd.getFloat();
		const GLfloat	g1		= rnd.getFloat();
		const GLfloat	b1		= rnd.getFloat();
		const GLfloat	a1		= rnd.getFloat();
		const GLfloat	r2		= rnd.getFloat();
		const GLfloat	g2		= rnd.getFloat();
		const GLfloat	b2		= rnd.getFloat();
		const GLfloat	a2		= rnd.getFloat();

		GLU_CHECK_CALL_ERROR(gl.clearColor(r1, g1, b1, a1), gl.getError());
		GLU_CHECK_CALL_ERROR(gl.clear(GL_COLOR_BUFFER_BIT), gl.getError());
		gl.scissor(x, y, width, height);
		gl.enable(GL_SCISSOR_TEST);
		gl.clearColor(r2, g2, b2, a2);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.disable(GL_SCISSOR_TEST);
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_CHECK_ERROR(gl.getError());
}